

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

bool cfd::core::WallyUtil::CheckValidMnemonic
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *mnemonic,string *language)

{
  int iVar1;
  words *w;
  string mnemonic_sentence;
  allocator local_51;
  string local_50;
  string local_30;
  
  w = Bip39GetWordlist(language);
  ::std::__cxx11::string::string((string *)&local_50," ",&local_51);
  StringUtil::Join(&local_30,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)mnemonic,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  iVar1 = bip39_mnemonic_validate(w,local_30._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&local_30);
  return iVar1 == 0;
}

Assistant:

bool WallyUtil::CheckValidMnemonic(
    const std::vector<std::string>& mnemonic, const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);
  std::string mnemonic_sentence =
      StringUtil::Join(mnemonic, kMnemonicDelimiter);

  int ret = bip39_mnemonic_validate(wally_wordlist, mnemonic_sentence.c_str());
  if (ret != WALLY_OK) return false;
  return true;
}